

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRGBA.cpp
# Opt level: O0

RGBA tcu::computeAbsDiffMasked(RGBA a,RGBA b,deUint32 cmpMask)

{
  deUint32 dVar1;
  deUint32 dVar2;
  int iVar3;
  int ab;
  int aa;
  int bb;
  int ba;
  int gb;
  int ga;
  int rb;
  int ra;
  deUint8 aDiff;
  deUint8 bDiff;
  deUint8 gDiff;
  deUint8 rDiff;
  deUint32 bPacked;
  deUint32 aPacked;
  deUint32 cmpMask_local;
  RGBA b_local;
  RGBA a_local;
  
  aPacked = b.m_value;
  cmpMask_local = a.m_value;
  dVar1 = RGBA::getPacked((RGBA *)&cmpMask_local);
  dVar2 = RGBA::getPacked((RGBA *)&aPacked);
  rb._3_1_ = 0;
  rb._2_1_ = 0;
  rb._1_1_ = 0;
  rb._0_1_ = 0;
  if ((cmpMask & 1) != 0) {
    iVar3 = deAbs32((dVar1 & 0xff) - (dVar2 & 0xff));
    rb._3_1_ = (byte)iVar3;
  }
  if ((cmpMask & 2) != 0) {
    iVar3 = deAbs32((dVar1 >> 8 & 0xff) - (dVar2 >> 8 & 0xff));
    rb._2_1_ = (byte)iVar3;
  }
  if ((cmpMask & 4) != 0) {
    iVar3 = deAbs32((dVar1 >> 0x10 & 0xff) - (dVar2 >> 0x10 & 0xff));
    rb._1_1_ = (byte)iVar3;
  }
  if ((cmpMask & 8) != 0) {
    iVar3 = deAbs32((dVar1 >> 0x18) - (dVar2 >> 0x18));
    rb._0_1_ = (byte)iVar3;
  }
  RGBA::RGBA(&b_local,(uint)rb._3_1_,(uint)rb._2_1_,(uint)rb._1_1_,(uint)(byte)rb);
  return (RGBA)b_local.m_value;
}

Assistant:

RGBA computeAbsDiffMasked (RGBA a, RGBA b, deUint32 cmpMask)
{
	deUint32	aPacked = a.getPacked();
	deUint32	bPacked = b.getPacked();
	deUint8		rDiff	= 0;
	deUint8		gDiff	= 0;
	deUint8		bDiff	= 0;
	deUint8		aDiff	= 0;

	if (cmpMask & RGBA::RED_MASK)
	{
		int ra = (aPacked >> RGBA::RED_SHIFT) & 0xFF;
		int rb = (bPacked >> RGBA::RED_SHIFT) & 0xFF;

		rDiff = (deUint8)deAbs32(ra - rb);
	}

	if (cmpMask & RGBA::GREEN_MASK)
	{
		int ga = (aPacked >> RGBA::GREEN_SHIFT) & 0xFF;
		int gb = (bPacked >> RGBA::GREEN_SHIFT) & 0xFF;

		gDiff = (deUint8)deAbs32(ga - gb);
	}

	if (cmpMask & RGBA::BLUE_MASK)
	{
		int ba = (aPacked >> RGBA::BLUE_SHIFT) & 0xFF;
		int bb = (bPacked >> RGBA::BLUE_SHIFT) & 0xFF;

		bDiff = (deUint8)deAbs32(ba - bb);
	}

	if (cmpMask & RGBA::ALPHA_MASK)
	{
		int aa = (aPacked >> RGBA::ALPHA_SHIFT) & 0xFF;
		int ab = (bPacked >> RGBA::ALPHA_SHIFT) & 0xFF;

		aDiff = (deUint8)deAbs32(aa - ab);
	}

	return RGBA(rDiff,gDiff,bDiff,aDiff);
}